

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O0

void __thiscall
sptk::GaussianMixtureModeling::GaussianMixtureModeling
          (GaussianMixtureModeling *this,int num_order,int num_mixture,int num_iteration,
          double convergence_threshold,CovarianceType covariance_type,
          vector<int,_std::allocator<int>_> *block_size,double weight_floor,double variance_floor,
          InitializationType initialization_type,int log_interval,double smoothing_parameter,
          vector<double,_std::allocator<double>_> *ubm_weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *ubm_mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
          *ubm_covariance_matrices)

{
  int iVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result_00;
  bool bVar2;
  size_type sVar3;
  reference piVar4;
  reference pvVar5;
  const_reference pvVar6;
  double *pdVar7;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined4 in_stack_00000008;
  int in_stack_00000010;
  int m;
  int l;
  int end_m;
  int begin_m;
  int col;
  int end_l;
  int begin_l;
  int row;
  vector<int,_std::allocator<int>_> offset;
  int num_block;
  int b;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int sum;
  int length;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  anon_class_8_1_315121fe in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe00;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe2c;
  value_type vVar8;
  SymmetricMatrix *in_stack_fffffffffffffe30;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe40;
  bool local_189;
  Row local_130;
  Row local_118;
  Row local_100;
  value_type local_e8;
  value_type local_e4;
  int local_e0;
  value_type local_dc;
  int local_d8;
  int local_d4;
  value_type local_d0;
  int local_cc;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  vector<int,_std::allocator<int>_> local_98;
  int local_80;
  int local_7c;
  int *local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70 [2];
  int local_5c;
  int local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  *in_RDI = &PTR__GaussianMixtureModeling_00138b50;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  in_RDI[3] = in_XMM0_Qa;
  *(undefined4 *)(in_RDI + 4) = in_R8D;
  local_48 = in_XMM3_Qa;
  local_40 = in_XMM2_Qa;
  local_38 = in_XMM1_Qa;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe40,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe38);
  in_RDI[8] = local_38;
  in_RDI[9] = local_40;
  *(undefined4 *)(in_RDI + 10) = in_stack_00000008;
  *(int *)((long)in_RDI + 0x54) = in_stack_00000010;
  in_RDI[0xb] = local_48;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffe40,
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)in_stack_fffffffffffffe38);
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
             in_stack_fffffffffffffe40,
             (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
             in_stack_fffffffffffffe38);
  local_189 = false;
  if (*(int *)(in_RDI + 4) == 0) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 5));
    local_189 = sVar3 == 1;
  }
  *(bool *)(in_RDI + 0x15) = local_189;
  *(undefined1 *)((long)in_RDI + 0xa9) = 1;
  SymmetricMatrix::SymmetricMatrix(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10810d);
  if (((((*(int *)(in_RDI + 1) < 0) || (*(int *)((long)in_RDI + 0xc) < 1)) ||
       ((*(int *)(in_RDI + 10) == 1 && (bVar2 = IsPowerOfTwo(*(int *)((long)in_RDI + 0xc)), !bVar2))
       )) || (((((*(int *)(in_RDI + 2) < 1 || ((double)in_RDI[3] <= 0.0 && (double)in_RDI[3] != 0.0)
                 ) || ((double)in_RDI[8] <= 0.0 && (double)in_RDI[8] != 0.0)) ||
               ((1.0 / (double)*(int *)((long)in_RDI + 0xc) < (double)in_RDI[8] ||
                ((double)in_RDI[9] <= 0.0 && (double)in_RDI[9] != 0.0)))) || (in_stack_00000010 < 1)
              ))) ||
     (((double)in_RDI[0xb] <= 0.0 && (double)in_RDI[0xb] != 0.0 || (1.0 < (double)in_RDI[0xb])))) {
    *(undefined1 *)((long)in_RDI + 0xa9) = 0;
  }
  else {
    local_58 = *(int *)(in_RDI + 1) + 1;
    local_5c = 0;
    local_70[0]._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    local_78 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_fffffffffffffdf0.smoothing_parameter,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8)), bVar2)
    {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(local_70);
      local_7c = *piVar4;
      if (local_7c < 1) {
        *(undefined1 *)((long)in_RDI + 0xa9) = 0;
        return;
      }
      local_5c = local_7c + local_5c;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (local_70);
    }
    if (local_5c == local_58) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 5));
      local_80 = (int)sVar3;
      std::allocator<int>::allocator((allocator<int> *)0x1083cd);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (size_type)in_stack_fffffffffffffe08._M_current,
                 (allocator_type *)in_stack_fffffffffffffe00._M_current);
      std::allocator<int>::~allocator((allocator<int> *)0x1083f3);
      local_a8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      local_b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      local_c0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      local_b8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)
                                    ,(difference_type)in_stack_fffffffffffffdf0.smoothing_parameter)
      ;
      __result._M_current._7_1_ = in_stack_fffffffffffffdff;
      __result._M_current._0_7_ = in_stack_fffffffffffffdf8;
      local_c8 = (int *)std::
                        partial_sum<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                  ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )in_stack_fffffffffffffe08._M_current,
                                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )in_stack_fffffffffffffe00._M_current,__result);
      SymmetricMatrix::Resize
                ((SymmetricMatrix *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (int)((ulong)in_stack_fffffffffffffe08._M_current >> 0x20));
      SymmetricMatrix::Fill
                ((SymmetricMatrix *)in_stack_fffffffffffffe00._M_current,
                 (double)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      for (local_cc = 0; local_cc < local_80; local_cc = local_cc + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,(long)local_cc);
        local_d0 = *pvVar5;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,(long)local_cc);
        vVar8 = *pvVar5;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)local_cc);
        local_d4 = vVar8 + *pvVar6;
        for (local_d8 = 0; local_d8 < local_80; local_d8 = local_d8 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,(long)local_d8);
          local_dc = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,(long)local_d8);
          iVar1 = *pvVar5;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)local_d8);
          local_e0 = iVar1 + *pvVar6;
          for (local_e4 = local_d0; local_e4 < local_d4; local_e4 = local_e4 + 1) {
            for (local_e8 = local_dc; local_e8 < local_e0; local_e8 = local_e8 + 1) {
              if (*(int *)(in_RDI + 4) == 0) {
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)local_cc
                                   );
                iVar1 = *pvVar6;
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 5),(long)local_d8
                                   );
                if (iVar1 == *pvVar6) {
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_98,(long)(local_cc + 1));
                  in_stack_fffffffffffffe14 = *pvVar5 - local_e4;
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_98,(long)(local_d8 + 1));
                  if (in_stack_fffffffffffffe14 != *pvVar5 - local_e8) {
                    SymmetricMatrix::operator[]
                              ((SymmetricMatrix *)
                               CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                               (int)((ulong)in_stack_fffffffffffffdf0.smoothing_parameter >> 0x20));
                    in_stack_fffffffffffffe08._M_current =
                         SymmetricMatrix::Row::operator[]
                                   ((Row *)in_stack_fffffffffffffdf0.smoothing_parameter,
                                    in_stack_fffffffffffffdec);
                    *in_stack_fffffffffffffe08._M_current = 0.0;
                    SymmetricMatrix::Row::~Row(&local_118);
                  }
                }
                else {
                  SymmetricMatrix::operator[]
                            ((SymmetricMatrix *)
                             CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                             (int)((ulong)in_stack_fffffffffffffdf0.smoothing_parameter >> 0x20));
                  pdVar7 = SymmetricMatrix::Row::operator[]
                                     ((Row *)in_stack_fffffffffffffdf0.smoothing_parameter,
                                      in_stack_fffffffffffffdec);
                  *pdVar7 = 0.0;
                  SymmetricMatrix::Row::~Row(&local_100);
                }
              }
              else if ((*(int *)(in_RDI + 4) == 1) && (local_cc != local_d8)) {
                SymmetricMatrix::operator[]
                          ((SymmetricMatrix *)
                           CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                           (int)((ulong)in_stack_fffffffffffffdf0.smoothing_parameter >> 0x20));
                in_stack_fffffffffffffe00._M_current =
                     SymmetricMatrix::Row::operator[]
                               ((Row *)in_stack_fffffffffffffdf0.smoothing_parameter,
                                in_stack_fffffffffffffdec);
                ((SymmetricMatrix *)in_stack_fffffffffffffe00._M_current)->_vptr_SymmetricMatrix =
                     (_func_int **)0x0;
                SymmetricMatrix::Row::~Row(&local_130);
              }
            }
          }
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe00._M_current);
      if (((*(int *)(in_RDI + 10) != 2) && ((double)in_RDI[0xb] <= 0.0)) ||
         (in_stack_fffffffffffffdff =
               anon_unknown.dwarf_f3a8::CheckGmm
                         (in_stack_fffffffffffffe10,
                          (int)((ulong)in_stack_fffffffffffffe08._M_current >> 0x20),
                          (vector<double,_std::allocator<double>_> *)
                          in_stack_fffffffffffffe00._M_current,
                          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                          (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                          in_stack_fffffffffffffdf0.smoothing_parameter),
         (bool)in_stack_fffffffffffffdff)) {
        if (0.0 < (double)in_RDI[0xb]) {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     (size_type)in_stack_fffffffffffffe08._M_current);
          std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
          __result_00._M_current._7_1_ = in_stack_fffffffffffffdff;
          __result_00._M_current._0_7_ = in_stack_fffffffffffffdf8;
          std::
          transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::GaussianMixtureModeling::GaussianMixtureModeling(int,int,int,double,sptk::GaussianMixtureModeling::CovarianceType,std::vector<int,std::allocator<int>>,double,double,sptk::GaussianMixtureModeling::InitializationType,int,double,std::vector<double,std::allocator<double>>const&,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>const&,std::vector<sptk::SymmetricMatrix,std::allocator<sptk::SymmetricMatrix>>const&)::__0>
                    (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,__result_00,
                     in_stack_fffffffffffffdf0);
        }
      }
      else {
        *(undefined1 *)((long)in_RDI + 0xa9) = 0;
      }
    }
    else {
      *(undefined1 *)((long)in_RDI + 0xa9) = 0;
    }
  }
  return;
}

Assistant:

GaussianMixtureModeling::GaussianMixtureModeling(
    int num_order, int num_mixture, int num_iteration,
    double convergence_threshold, CovarianceType covariance_type,
    std::vector<int> block_size, double weight_floor, double variance_floor,
    InitializationType initialization_type, int log_interval,
    double smoothing_parameter, const std::vector<double>& ubm_weights,
    const std::vector<std::vector<double> >& ubm_mean_vectors,
    const std::vector<SymmetricMatrix>& ubm_covariance_matrices)
    : num_order_(num_order),
      num_mixture_(num_mixture),
      num_iteration_(num_iteration),
      convergence_threshold_(convergence_threshold),
      covariance_type_(covariance_type),
      block_size_(block_size),
      weight_floor_(weight_floor),
      variance_floor_(variance_floor),
      initialization_type_(initialization_type),
      log_interval_(log_interval),
      smoothing_parameter_(smoothing_parameter),
      ubm_weights_(ubm_weights),
      ubm_mean_vectors_(ubm_mean_vectors),
      ubm_covariance_matrices_(ubm_covariance_matrices),
      is_diagonal_(kDiagonal == covariance_type_ && 1 == block_size_.size()),
      is_valid_(true) {
  if (num_order_ < 0 || num_mixture_ <= 0 ||
      (kKMeans == initialization_type_ && !sptk::IsPowerOfTwo(num_mixture_)) ||
      num_iteration_ <= 0 || convergence_threshold_ < 0.0 ||
      weight_floor_ < 0.0 || 1.0 / num_mixture_ < weight_floor_ ||
      variance_floor_ < 0.0 || log_interval <= 0 ||
      smoothing_parameter_ < 0.0 || 1.0 < smoothing_parameter_) {
    is_valid_ = false;
    return;
  }

  const int length(num_order_ + 1);

  // Check block size.
  {
    int sum(0);
    for (int b : block_size) {
      if (b <= 0) {
        is_valid_ = false;
        return;
      }
      sum += b;
    }
    if (sum != length) {
      is_valid_ = false;
      return;
    }
  }

  // Create mask of covariance.
  {
    const int num_block(static_cast<int>(block_size_.size()));
    std::vector<int> offset(num_block + 1);
    std::partial_sum(block_size_.begin(), block_size_.end(),
                     offset.begin() + 1);

    mask_.Resize(length);
    mask_.Fill(1.0);
    for (int row(0); row < num_block; ++row) {
      const int begin_l(offset[row]);
      const int end_l(offset[row] + block_size_[row]);
      for (int col(0); col < num_block; ++col) {
        const int begin_m(offset[col]);
        const int end_m(offset[col] + block_size_[col]);
        for (int l(begin_l); l < end_l; ++l) {
          for (int m(begin_m); m < end_m; ++m) {
            if (kDiagonal == covariance_type_) {
              if (block_size_[row] != block_size_[col]) {
                mask_[l][m] = 0.0;
              } else if (offset[row + 1] - l != offset[col + 1] - m) {
                mask_[l][m] = 0.0;
              }
            } else if (kFull == covariance_type_) {
              if (row != col) {
                mask_[l][m] = 0.0;
              }
            }
          }
        }
      }
    }
  }

  // Check the sanity of universal background model.
  if (kUbm == initialization_type_ || 0.0 < smoothing_parameter_) {
    if (!CheckGmm(num_mixture, length, ubm_weights, ubm_mean_vectors,
                  ubm_covariance_matrices)) {
      is_valid_ = false;
      return;
    }
  }

  if (0.0 < smoothing_parameter_) {
    xi_.resize(num_mixture_);
    std::transform(
        ubm_weights.begin(), ubm_weights.end(), xi_.begin(),
        [smoothing_parameter](double w) { return smoothing_parameter * w; });
  }
}